

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::InlConstFoldArg(Inline *this,Instr *instr,Instr **callerArgOuts,ArgSlot callerArgOutCount)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  Instr *instr_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *this_01;
  IntConstType local_38;
  IntConstType value;
  
  if (instr->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1223,"(instr->m_opcode == Js::OpCode::ArgOut_A)",
                       "instr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar3) goto LAB_0054bc1b;
    *puVar5 = 0;
  }
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->topFunc->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->topFunc->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,InlinerConstFoldPhase,sourceContextId,functionId);
  if (!bVar3) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::HasTry(pJVar6);
    if ((!bVar3) && (OVar4 = IR::Opnd::GetKind(instr->m_src1), OVar4 == OpndKindReg)) {
      this_00 = instr->m_src1;
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_0054bc1b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      instr_00 = (Instr *)pp_Var1[5];
      if ((instr_00 != (Instr *)0x0 & *(byte *)(pp_Var1 + 3)) == 1) {
        bVar3 = InlConstFold(this,instr_00,&local_38,callerArgOuts,callerArgOutCount);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool Inline::InlConstFoldArg(IR::Instr *instr, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount)
{
    Assert(instr->m_opcode == Js::OpCode::ArgOut_A);

    if (PHASE_OFF(Js::InlinerConstFoldPhase, instr->m_func->GetTopFunc()))
    {
        return false;
    }
    if (instr->m_func->GetJITFunctionBody()->HasTry())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IntConstType value;

    if (!src1->IsRegOpnd())
    {
        return false;
    }

    StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if (!sym->IsSingleDef())
    {
        return false;
    }

    IR::Instr *instrDef = sym->GetInstrDef();
    if (!this->InlConstFold(instrDef, &value, callerArgOuts, callerArgOutCount))
    {
        return false;
    }
    return true;
}